

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_l3.c
# Opt level: O2

int picnic3_l3_verify(picnic3_l3_publickey_t *pk,uint8_t *message,size_t message_len,
                     uint8_t *signature,size_t signature_len)

{
  int iVar1;
  picnic_instance_t *instance;
  
  if ((signature_len != 0 && (signature != (uint8_t *)0x0 && pk != (picnic3_l3_publickey_t *)0x0))
     && (instance = picnic_instance_get(Picnic3_L3), instance != (picnic_instance_t *)0x0)) {
    iVar1 = impl_verify_picnic3(instance,pk->data + 0x18,pk->data,message,message_len,signature,
                                signature_len);
    return iVar1;
  }
  return -1;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic3_l3_verify(const picnic3_l3_publickey_t* pk,
                                                  const uint8_t* message, size_t message_len,
                                                  const uint8_t* signature, size_t signature_len) {
  if (!pk || !signature || !signature_len) {
    return -1;
  }

  const picnic_instance_t* instance = picnic_instance_get(PARAM);
  if (!instance) {
    return -1;
  }

  const uint8_t* pk_c  = PK_C(pk);
  const uint8_t* pk_pt = PK_PT(pk);

  return impl_verify_picnic3(instance, pk_pt, pk_c, message, message_len, signature,
                               signature_len);
}